

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O2

void Test_DeathSTREQ_logging::RunTest(void)

{
  undefined *puVar1;
  int iVar2;
  string *psVar3;
  ostream *poVar4;
  char *pcVar5;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  puVar1 = google::g_logging_fail_func;
  google::g_called_abort = '\0';
  google::g_logging_fail_func = google::CalledAbort;
  iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
  if (iVar2 == 0) {
    psVar3 = google::CheckstrcmptrueImpl_abi_cxx11_((char *)0x0,"this","__null == \"this\"");
    if (psVar3 != (string *)0x0) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_60,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x254);
      poVar4 = google::LogMessage::stream((LogMessage *)&local_60);
      std::operator<<(poVar4,(string *)psVar3);
      goto LAB_0011808f;
    }
  }
  if (google::g_called_abort == '\0') {
    pcVar5 = "CHECK_STREQ(NULL, \"this\")";
  }
  else {
    google::g_called_abort = '\0';
    google::g_logging_fail_func = google::CalledAbort;
    iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
    if (iVar2 == 0) {
      psVar3 = google::CheckstrcmptrueImpl_abi_cxx11_("this","siht","\"this\" == \"siht\"");
      if (psVar3 != (string *)0x0) {
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_60,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,0x255);
        poVar4 = google::LogMessage::stream((LogMessage *)&local_60);
        std::operator<<(poVar4,(string *)psVar3);
        goto LAB_0011808f;
      }
    }
    if (google::g_called_abort == '\0') {
      pcVar5 = "CHECK_STREQ(\"this\", \"siht\")";
      goto LAB_00117f14;
    }
    google::g_called_abort = '\0';
    google::g_logging_fail_func = google::CalledAbort;
    iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
    if (iVar2 == 0) {
      psVar3 = google::CheckstrcasecmptrueImpl_abi_cxx11_((char *)0x0,"siht","__null == \"siht\"");
      if (psVar3 != (string *)0x0) {
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_60,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,0x256);
        poVar4 = google::LogMessage::stream((LogMessage *)&local_60);
        std::operator<<(poVar4,(string *)psVar3);
        goto LAB_0011808f;
      }
    }
    if (google::g_called_abort == '\0') {
      pcVar5 = "CHECK_STRCASEEQ(NULL, \"siht\")";
      goto LAB_00117f14;
    }
    google::g_called_abort = '\0';
    google::g_logging_fail_func = google::CalledAbort;
    iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
    if (iVar2 == 0) {
      psVar3 = google::CheckstrcasecmptrueImpl_abi_cxx11_("this","siht","\"this\" == \"siht\"");
      if (psVar3 != (string *)0x0) {
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_60,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,599);
        poVar4 = google::LogMessage::stream((LogMessage *)&local_60);
        std::operator<<(poVar4,(string *)psVar3);
        goto LAB_0011808f;
      }
    }
    if (google::g_called_abort == '\0') {
      pcVar5 = "CHECK_STRCASEEQ(\"this\", \"siht\")";
      goto LAB_00117f14;
    }
    google::g_called_abort = '\0';
    google::g_logging_fail_func = google::CalledAbort;
    iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
    if (iVar2 == 0) {
      psVar3 = google::CheckstrcmpfalseImpl_abi_cxx11_((char *)0x0,(char *)0x0,"__null != __null");
      if (psVar3 != (string *)0x0) {
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_60,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,600);
        poVar4 = google::LogMessage::stream((LogMessage *)&local_60);
        std::operator<<(poVar4,(string *)psVar3);
        goto LAB_0011808f;
      }
    }
    if (google::g_called_abort == '\0') {
      pcVar5 = "CHECK_STRNE(NULL, NULL)";
      goto LAB_00117f14;
    }
    google::g_called_abort = '\0';
    google::g_logging_fail_func = google::CalledAbort;
    iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
    if (iVar2 == 0) {
      psVar3 = google::CheckstrcmpfalseImpl_abi_cxx11_("this","this","\"this\" != \"this\"");
      if (psVar3 != (string *)0x0) {
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_60,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,0x259);
        poVar4 = google::LogMessage::stream((LogMessage *)&local_60);
        std::operator<<(poVar4,(string *)psVar3);
        goto LAB_0011808f;
      }
    }
    if (google::g_called_abort == '\0') {
      pcVar5 = "CHECK_STRNE(\"this\", \"this\")";
    }
    else {
      google::g_called_abort = '\0';
      google::g_logging_fail_func = google::CalledAbort;
      iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
      if (iVar2 == 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"a",&local_61);
        std::operator+(&local_60,&local_40,"b");
        psVar3 = google::CheckstrcmptrueImpl_abi_cxx11_
                           (local_60._M_dataplus._M_p,"abc",
                            "(string(\"a\")+\"b\").c_str() == \"abc\"");
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_40);
        if (psVar3 != (string *)0x0) {
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_60,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                     ,0x25a);
          poVar4 = google::LogMessage::stream((LogMessage *)&local_60);
          std::operator<<(poVar4,(string *)psVar3);
LAB_0011808f:
          google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_60);
        }
      }
      google::g_logging_fail_func = puVar1;
      if (google::g_called_abort != '\0') {
        return;
      }
      pcVar5 = "CHECK_STREQ((string(\"a\")+\"b\").c_str(), \"abc\")";
    }
  }
LAB_00117f14:
  google::g_logging_fail_func = puVar1;
  fprintf(_stderr,"Function didn\'t die (%s): %s\n","",pcVar5);
  exit(1);
}

Assistant:

TEST(DeathSTREQ, logging) {
  ASSERT_DEATH(CHECK_STREQ(NULL, "this"), "");
  ASSERT_DEATH(CHECK_STREQ("this", "siht"), "");
  ASSERT_DEATH(CHECK_STRCASEEQ(NULL, "siht"), "");
  ASSERT_DEATH(CHECK_STRCASEEQ("this", "siht"), "");
  ASSERT_DEATH(CHECK_STRNE(NULL, NULL), "");
  ASSERT_DEATH(CHECK_STRNE("this", "this"), "");
  ASSERT_DEATH(CHECK_STREQ((string("a")+"b").c_str(), "abc"), "");
}